

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O1

void VP8LResidualImage(int width,int height,int bits,int low_effort,uint32_t *argb,
                      uint32_t *argb_scratch,uint32_t *image,int near_lossless_quality,int exact,
                      int used_subtract_green)

{
  uint uVar1;
  bool bVar2;
  uint32_t *puVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int (*paiVar9) [256];
  VP8LPredictorAddSubFunc *pp_Var10;
  uint8_t *max_diffs;
  byte bVar11;
  uint uVar12;
  long lVar13;
  int *piVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  int (*paiVar20) [256];
  ulong uVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  int max_quantization;
  long lVar25;
  ulong uVar26;
  int *piVar27;
  uint32_t *current_row;
  int iVar28;
  uint32_t *puVar29;
  int *piVar30;
  float fVar31;
  undefined1 auVar32 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar33 [16];
  double dVar34;
  undefined1 auVar35 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  uint8_t *local_3288;
  uint32_t *local_3280;
  uint8_t *tmp8;
  int local_3268;
  uint32_t *local_3260;
  uint32_t *local_3248;
  uint local_3218;
  uint local_3214;
  uint local_3210;
  float local_320c;
  ulong local_3208;
  int (*local_31f0) [256];
  uint32_t local_3138 [64];
  int histo [4] [256];
  int histo_stack_2 [4] [256];
  int histo_stack_1 [4] [256];
  
  auVar33 = _DAT_00156820;
  bVar11 = (byte)bits;
  uVar15 = 1 << (bVar11 & 0x1f);
  uVar22 = (width + uVar15) - 1 >> (bVar11 & 0x1f);
  uVar18 = (height + uVar15) - 1 >> (bVar11 & 0x1f);
  max_quantization =
       1 << (((char)(uint)((ulong)((long)near_lossless_quality * -0x66666667) >> 0x23) -
             (char)((long)near_lossless_quality * -0x66666667 >> 0x3f)) + 5U & 0x1f);
  if (low_effort == 0) {
    memset(histo,0,0x1000);
    if (0 < (int)uVar18) {
      lVar5 = (long)width;
      local_3208 = 0;
      do {
        if (0 < (int)uVar22) {
          iVar24 = (int)local_3208 << (bVar11 & 0x1f);
          uVar6 = (ulong)(uint)(height - iVar24);
          if ((int)uVar15 < height - iVar24) {
            uVar6 = (ulong)uVar15;
          }
          lVar7 = local_3208 * (long)(int)uVar22;
          uVar21 = 0;
          do {
            iVar4 = (int)uVar21 << (bVar11 & 0x1f);
            uVar16 = width - iVar4;
            uVar19 = (ulong)uVar16;
            if ((int)uVar15 < (int)uVar16) {
              uVar19 = (ulong)uVar15;
            }
            local_3210 = 0xff;
            local_3214 = 0xff;
            if (uVar21 != 0) {
              local_3214 = (uint)*(byte *)((long)image + uVar21 * 4 + lVar7 * 4 + -3);
            }
            if (local_3208 != 0) {
              local_3210 = (uint)*(byte *)((long)image +
                                          uVar21 * 4 + (local_3208 - 1) * (long)(int)uVar22 * 4 + 1)
              ;
            }
            uVar12 = (uint)(0 < (int)uVar21 << (bVar11 & 0x1f));
            iVar28 = (int)uVar19;
            iVar23 = uVar12 + iVar28;
            lVar13 = (long)(int)(iVar4 - uVar12);
            uVar12 = 0;
            local_320c = 1e+30;
            local_31f0 = histo_stack_2;
            local_3218 = 0;
            paiVar9 = histo_stack_1;
            puVar29 = argb_scratch + lVar5 + 1;
            local_3260 = argb_scratch;
            do {
              memset(paiVar9,0,0x1000);
              if (0 < iVar24) {
                memcpy(puVar29 + lVar13,argb + (iVar24 + -1) * width + lVar13,(long)iVar23 * 4 + 4);
              }
              local_3268 = (int)uVar6;
              if (0 < local_3268) {
                uVar26 = 0;
                local_3280 = puVar29;
                do {
                  puVar29 = local_3260;
                  lVar25 = uVar26 + (long)iVar24;
                  bVar2 = lVar25 < (long)height + -1;
                  memcpy(puVar29 + lVar13,argb + lVar13 + lVar25 * lVar5,
                         (long)(int)(iVar23 + (uint)bVar2) << 2);
                  if (bVar2 && (0 < lVar25 && 1 < max_quantization)) {
                    MaxDiffsForRow((uint)((int)uVar15 < (int)uVar16) + iVar23,width,
                                   argb + lVar13 + lVar25 * lVar5,
                                   (uint8_t *)((long)(argb_scratch + lVar5 * 2 + 2) + lVar13),
                                   used_subtract_green);
                  }
                  GetResidual(width,height,local_3280,puVar29,
                              (uint8_t *)(argb_scratch + lVar5 * 2 + 2),uVar12,iVar4,iVar28 + iVar4,
                              (int)lVar25,max_quantization,exact,used_subtract_green,local_3138);
                  if (0 < iVar28) {
                    uVar8 = 0;
                    do {
                      uVar1 = local_3138[uVar8];
                      (*paiVar9)[uVar1 >> 0x18] = (*paiVar9)[uVar1 >> 0x18] + 1;
                      piVar30 = (int *)((long)paiVar9[1] + (ulong)(uVar1 >> 0xe & 0x3fc));
                      *piVar30 = *piVar30 + 1;
                      paiVar9[2][uVar1 >> 8 & 0xff] = paiVar9[2][uVar1 >> 8 & 0xff] + 1;
                      paiVar9[3][uVar1 & 0xff] = paiVar9[3][uVar1 & 0xff] + 1;
                      uVar8 = uVar8 + 1;
                    } while (uVar19 != uVar8);
                  }
                  uVar26 = uVar26 + 1;
                  local_3260 = local_3280;
                  local_3280 = puVar29;
                } while (uVar26 != uVar6);
              }
              piVar27 = *paiVar9 + 0xff;
              piVar30 = *paiVar9 + 1;
              auVar33 = ZEXT816(0);
              lVar25 = 0;
              do {
                dVar34 = (double)paiVar9[lVar25][0];
                lVar17 = 0;
                dVar36 = 0.94;
                piVar14 = piVar30;
                do {
                  dVar34 = dVar34 + (double)(piVar27[lVar17] + *piVar14) * dVar36;
                  dVar36 = dVar36 * 0.6;
                  lVar17 = lVar17 + -1;
                  piVar14 = piVar14 + 1;
                } while (lVar17 != -0xf);
                fVar31 = (*VP8LCombinedShannonEntropy)(paiVar9[lVar25],histo[lVar25]);
                auVar33._0_8_ = (double)fVar31 + auVar33._0_8_ + (double)(float)(dVar34 * -0.1);
                auVar33._8_8_ = extraout_XMM0_Qb;
                lVar25 = lVar25 + 1;
                piVar27 = piVar27 + 0x100;
                piVar30 = piVar30 + 0x100;
              } while (lVar25 != 4);
              fVar31 = (float)auVar33._0_8_;
              if (uVar12 == local_3214) {
                fVar31 = fVar31 + -15.0;
              }
              if (uVar12 == local_3210) {
                fVar31 = fVar31 + -15.0;
              }
              paiVar20 = paiVar9;
              if (fVar31 < local_320c) {
                paiVar20 = local_31f0;
                local_3218 = uVar12;
                local_320c = fVar31;
                local_31f0 = paiVar9;
              }
              uVar12 = uVar12 + 1;
              paiVar9 = paiVar20;
            } while (uVar12 != 0xe);
            paiVar9 = histo;
            lVar13 = 0;
            do {
              lVar25 = 0;
              do {
                (*paiVar9)[lVar25] = (*paiVar9)[lVar25] + (*local_31f0)[lVar25];
                lVar25 = lVar25 + 1;
              } while (lVar25 != 0x100);
              lVar13 = lVar13 + 1;
              paiVar9 = paiVar9 + 1;
              local_31f0 = local_31f0 + 1;
            } while (lVar13 != 4);
            image[lVar7 + uVar21] = local_3218 << 8 | 0xff000000;
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar22);
        }
        local_3208 = local_3208 + 1;
      } while (local_3208 != uVar18);
    }
  }
  else {
    uVar18 = uVar18 * uVar22;
    if (0 < (int)uVar18) {
      lVar5 = (ulong)uVar18 - 1;
      auVar32._8_4_ = (int)lVar5;
      auVar32._0_8_ = lVar5;
      auVar32._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar6 = 0;
      auVar32 = auVar32 ^ _DAT_00156820;
      auVar35 = _DAT_00157e40;
      auVar37 = _DAT_001555f0;
      do {
        auVar38 = auVar37 ^ auVar33;
        iVar24 = auVar32._4_4_;
        if ((bool)(~(auVar38._4_4_ == iVar24 && auVar32._0_4_ < auVar38._0_4_ ||
                    iVar24 < auVar38._4_4_) & 1)) {
          image[uVar6] = 0xff000b00;
        }
        if ((auVar38._12_4_ != auVar32._12_4_ || auVar38._8_4_ <= auVar32._8_4_) &&
            auVar38._12_4_ <= auVar32._12_4_) {
          image[uVar6 + 1] = 0xff000b00;
        }
        auVar38 = auVar35 ^ auVar33;
        iVar4 = auVar38._4_4_;
        if (iVar4 <= iVar24 && (iVar4 != iVar24 || auVar38._0_4_ <= auVar32._0_4_)) {
          image[uVar6 + 2] = 0xff000b00;
          image[uVar6 + 3] = 0xff000b00;
        }
        uVar6 = uVar6 + 4;
        lVar5 = auVar37._8_8_;
        auVar37._0_8_ = auVar37._0_8_ + 4;
        auVar37._8_8_ = lVar5 + 4;
        lVar5 = auVar35._8_8_;
        auVar35._0_8_ = auVar35._0_8_ + 4;
        auVar35._8_8_ = lVar5 + 4;
      } while ((uVar18 + 3 & 0xfffffffc) != uVar6);
    }
  }
  if (0 < height) {
    lVar5 = (long)width;
    tmp8 = (uint8_t *)(argb_scratch + lVar5 * 2 + 2);
    local_3288 = (uint8_t *)((long)argb_scratch + lVar5 * 9 + 8);
    uVar6 = (ulong)(uint)height;
    uVar21 = 0;
    local_3248 = argb_scratch + lVar5 + 1;
    do {
      current_row = argb_scratch;
      puVar29 = argb + uVar21 * lVar5;
      uVar19 = uVar21 + 1;
      memcpy(current_row,puVar29,(long)(int)(width + (uint)(uVar19 < uVar6)) << 2);
      if (low_effort == 0) {
        max_diffs = tmp8;
        if ((1 < max_quantization) &&
           (max_diffs = local_3288, local_3288 = tmp8, uVar21 + 2 < uVar6)) {
          MaxDiffsForRow(width,width,argb + uVar19 * lVar5,tmp8,used_subtract_green);
        }
        tmp8 = max_diffs;
        if (0 < width) {
          iVar24 = 0;
          do {
            iVar28 = iVar24 + uVar15;
            iVar4 = width;
            if (iVar28 < width) {
              iVar4 = iVar28;
            }
            GetResidual(width,height,local_3248,current_row,max_diffs,
                        (uint)*(byte *)((long)image +
                                       (long)(int)((iVar24 >> (bVar11 & 0x1f)) +
                                                  ((uint)uVar21 >> (bVar11 & 0x1f)) * uVar22) * 4 +
                                       1),iVar24,iVar4,(uint)uVar21,max_quantization,exact,
                        used_subtract_green,puVar29 + iVar24);
            iVar24 = iVar4;
          } while (iVar28 < width);
        }
      }
      else {
        pp_Var10 = VP8LPredictorsSub + 2;
        puVar3 = local_3248;
        if (uVar21 == 0) {
          pp_Var10 = VP8LPredictorsSub;
          puVar3 = (uint32_t *)0x0;
        }
        (**pp_Var10)(current_row,puVar3,1,puVar29);
        if (uVar21 == 0) {
          (*VP8LPredictorsSub[1])(current_row + 1,(uint32_t *)0x0,width + -1,puVar29 + 1);
        }
        else {
          (*VP8LPredictorsSub[0xb])(current_row + 1,local_3248 + 1,width + -1,puVar29 + 1);
        }
      }
      uVar21 = uVar19;
      argb_scratch = local_3248;
      local_3248 = current_row;
    } while (uVar19 != uVar6);
  }
  return;
}

Assistant:

void VP8LResidualImage(int width, int height, int bits, int low_effort,
                       uint32_t* const argb, uint32_t* const argb_scratch,
                       uint32_t* const image, int near_lossless_quality,
                       int exact, int used_subtract_green) {
  const int tiles_per_row = VP8LSubSampleSize(width, bits);
  const int tiles_per_col = VP8LSubSampleSize(height, bits);
  int tile_y;
  int histo[4][256];
  const int max_quantization = 1 << VP8LNearLosslessBits(near_lossless_quality);
  if (low_effort) {
    int i;
    for (i = 0; i < tiles_per_row * tiles_per_col; ++i) {
      image[i] = ARGB_BLACK | (kPredLowEffort << 8);
    }
  } else {
    memset(histo, 0, sizeof(histo));
    for (tile_y = 0; tile_y < tiles_per_col; ++tile_y) {
      int tile_x;
      for (tile_x = 0; tile_x < tiles_per_row; ++tile_x) {
        const int pred = GetBestPredictorForTile(width, height, tile_x, tile_y,
            bits, histo, argb_scratch, argb, max_quantization, exact,
            used_subtract_green, image);
        image[tile_y * tiles_per_row + tile_x] = ARGB_BLACK | (pred << 8);
      }
    }
  }

  CopyImageWithPrediction(width, height, bits, image, argb_scratch, argb,
                          low_effort, max_quantization, exact,
                          used_subtract_green);
}